

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GPUShaderFP64Test7::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,_variables *variables)

{
  uint uVar1;
  bool bVar2;
  uchar uVar3;
  uint uVar4;
  ostream *poVar5;
  size_type sVar6;
  const_reference pvVar7;
  ulong uVar8;
  _variable_type type;
  uint row;
  uint column;
  uint n_columns;
  uint n_component;
  uint index;
  string variable_type_string;
  uint n_variable_type_components;
  _variable_type variable_type;
  uint variable_array_size;
  uint n_variable;
  size_t n_variables;
  undefined1 local_1f8 [4];
  uint counter;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream result_sstream;
  ostream local_198;
  _variables *local_20;
  _variables *variables_local;
  GPUShaderFP64Test7 *this_local;
  
  local_20 = variables;
  variables_local = (_variables *)this;
  this_local = (GPUShaderFP64Test7 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(&local_198,"#version 400\n\n");
  if ((this->m_are_double_inputs_supported & 1U) != 0) {
    poVar5 = std::operator<<(&local_198,"#extension GL_ARB_vertex_attrib_64bit : require\n");
    getVariableDeclarations_abi_cxx11_(&local_1d8,this,"in_vs",local_20,"in");
    std::operator<<(poVar5,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  poVar5 = std::operator<<(&local_198,"out VS_DATA\n{\n");
  getVariableDeclarations_abi_cxx11_((string *)local_1f8,this,"vs",local_20,"");
  std::operator<<(poVar5,(string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::operator<<(&local_198,"};\n\nvoid main()\n{\n");
  n_variables._4_4_ = 1;
  sVar6 = std::
          vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
          ::size(local_20);
  for (variable_type = VARIABLE_TYPE_BOOL; variable_type < sVar6;
      variable_type = variable_type + VARIABLE_TYPE_BVEC2) {
    pvVar7 = std::
             vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             ::operator[](local_20,(ulong)variable_type);
    uVar1 = pvVar7->array_size;
    pvVar7 = std::
             vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             ::operator[](local_20,(ulong)variable_type);
    variable_type_string.field_2._12_4_ = pvVar7->type;
    variable_type_string.field_2._8_4_ =
         Utils::getNumberOfComponentsForVariableType(variable_type_string.field_2._12_4_);
    Utils::getVariableTypeString_abi_cxx11_
              ((string *)&n_component,(Utils *)(ulong)(uint)variable_type_string.field_2._12_4_,type
              );
    for (n_columns = 0; n_columns < uVar1; n_columns = n_columns + 1) {
      if (uVar1 == 1) {
        poVar5 = std::operator<<(&local_198,"vs_variable");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,variable_type);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = std::operator<<(poVar5,(string *)&n_component);
        std::operator<<(poVar5,"(");
      }
      else {
        poVar5 = std::operator<<(&local_198,"vs_variable");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,variable_type);
        poVar5 = std::operator<<(poVar5,"[");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,n_columns);
        poVar5 = std::operator<<(poVar5,"]");
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = std::operator<<(poVar5,(string *)&n_component);
        std::operator<<(poVar5,"(");
      }
      for (column = 0; column < (uint)variable_type_string.field_2._8_4_; column = column + 1) {
        uVar8 = (ulong)n_variables._4_4_;
        n_variables._4_4_ = n_variables._4_4_ + 1;
        std::ostream::operator<<(&local_198,(double)uVar8);
        if ((this->m_are_double_inputs_supported & 1U) != 0) {
          poVar5 = std::operator<<(&local_198," + in_vs_variable");
          std::ostream::operator<<(poVar5,variable_type);
          if (1 < uVar1) {
            poVar5 = std::operator<<(&local_198,"[");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,n_columns);
            std::operator<<(poVar5,"]");
          }
          pvVar7 = std::
                   vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                   ::operator[](local_20,(ulong)variable_type);
          bVar2 = Utils::isMatrixVariableType(pvVar7->type);
          if (bVar2) {
            uVar4 = Utils::getNumberOfColumnsForVariableType(variable_type_string.field_2._12_4_);
            poVar5 = std::operator<<(&local_198,"[");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,column % uVar4);
            poVar5 = std::operator<<(poVar5,"].");
            uVar3 = Utils::getComponentAtIndex(column / uVar4);
            std::operator<<(poVar5,uVar3);
          }
          else if (1 < (uint)variable_type_string.field_2._8_4_) {
            poVar5 = std::operator<<(&local_198,"[");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,column);
            std::operator<<(poVar5,"]");
          }
        }
        if (column != variable_type_string.field_2._8_4_ - 1) {
          std::operator<<(&local_198,", ");
        }
      }
      std::operator<<(&local_198,");\n");
    }
    std::__cxx11::string::~string((string *)&n_component);
  }
  std::operator<<(&local_198,"gl_Position = vec4(0, 0, 0, 1);\n}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getVertexShaderBody(const _variables& variables)
{
	std::stringstream result_sstream;

	/* Form pre-amble */
	result_sstream << "#version 400\n"
					  "\n";

	/* Define input variables if GL_ARB_vertex_attrib_64bit is supported */
	if (m_are_double_inputs_supported)
	{
		result_sstream << "#extension GL_ARB_vertex_attrib_64bit : require\n"
					   << getVariableDeclarations("in_vs", variables, "in");
	}

	/* Define output variables */
	result_sstream << "out VS_DATA\n"
					  "{\n"
				   << getVariableDeclarations("vs", variables);

	/* Define main() */
	result_sstream << "};\n"
					  "\n"
					  "void main()\n"
					  "{\n";

	/* Set output variable values */
	unsigned int counter	 = 1;
	const size_t n_variables = variables.size();

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size		 = variables[n_variable].array_size;
		Utils::_variable_type variable_type				 = variables[n_variable].type;
		const unsigned int	n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
		std::string			  variable_type_string		 = Utils::getVariableTypeString(variable_type);

		for (unsigned int index = 0; index < variable_array_size; ++index)
		{
			if (variable_array_size == 1)
			{
				result_sstream << "vs_variable" << n_variable << " = " << variable_type_string << "(";
			}
			else
			{
				result_sstream << "vs_variable" << n_variable << "[" << index << "]"
							   << " = " << variable_type_string << "(";
			}

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				result_sstream << (double)(counter++);

				/* Use input attributes, if available */
				if (m_are_double_inputs_supported)
				{
					result_sstream << " + in_vs_variable" << n_variable;

					if (variable_array_size > 1)
					{
						result_sstream << "[" << index << "]";
					}

					if (Utils::isMatrixVariableType(variables[n_variable].type))
					{
						const unsigned int n_columns = Utils::getNumberOfColumnsForVariableType(variable_type);
						const unsigned int column	= n_component % n_columns;
						const unsigned int row		 = n_component / n_columns;

						result_sstream << "[" << (column) << "]"
															 "."
									   << Utils::getComponentAtIndex(row);
					}
					else if (n_variable_type_components > 1)
					{
						result_sstream << "[" << n_component << "]";
					}
				}

				if (n_component != (n_variable_type_components - 1))
				{
					result_sstream << ", ";
				}
			} /* for (all components) */

			result_sstream << ");\n";
		}
	} /* for (all variable types) */

	/* We will be using geometry shader to lay out the actual vertices so
	 * the only thing we need to make sure is that the vertex never gets
	 * culled.
	 */
	result_sstream << "gl_Position = vec4(0, 0, 0, 1);\n"
					  "}\n";

	/* That's it */
	return result_sstream.str();
}